

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

ExpEmit __thiscall FxClassTypeCast::Emit(FxClassTypeCast *this,VMFunctionBuilder *build)

{
  FxExpression *pFVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ExpEmit EVar5;
  DObject *this_00;
  ulong uVar6;
  ExpEmit clsname;
  FName local_34;
  uint extraout_var;
  
  pFVar1 = this->basex;
  if (pFVar1->ValueType == (PType *)TypeName) {
    EVar5._0_4_ = (*pFVar1->_vptr_FxExpression[9])(pFVar1,build);
    EVar5.Konst = (bool)(char)extraout_var;
    EVar5.Fixed = (bool)(char)(extraout_var >> 8);
    EVar5.Final = (bool)(char)(extraout_var >> 0x10);
    EVar5.Target = (bool)(char)(extraout_var >> 0x18);
    clsname = EVar5;
    if ((extraout_var & 1) != 0) {
      __assert_fail("!clsname.Konst",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                    ,0x2568,"virtual ExpEmit FxClassTypeCast::Emit(VMFunctionBuilder *)");
    }
    uVar3 = VMFunctionBuilder::RegAvailability::Get(build->Registers + 3,1);
    VMFunctionBuilder::Emit(build,0x46,0,EVar5._0_4_ >> 0x10 & 0xff,EVar5._0_4_ & 0xffff);
    uVar4 = VMFunctionBuilder::GetConstantAddress(build,this->desttype,'\x01');
    VMFunctionBuilder::Emit(build,0x46,0,7,uVar4);
    local_34.Index = 0x242;
    this_00 = (DObject *)FindBuiltinFunction(&local_34,BuiltinNameToClass);
    bVar2 = DObject::IsKindOf(this_00,PSymbolVMFunction::RegistrationInfo.MyClass);
    if (!bVar2) {
      __assert_fail("sym->IsKindOf(RUNTIME_CLASS(PSymbolVMFunction))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                    ,0x2571,"virtual ExpEmit FxClassTypeCast::Emit(VMFunctionBuilder *)");
    }
    if (this_00[1]._vptr_DObject == (_func_int **)0x0) {
      __assert_fail("((PSymbolVMFunction *)sym)->Function != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                    ,0x2572,"virtual ExpEmit FxClassTypeCast::Emit(VMFunctionBuilder *)");
    }
    uVar4 = VMFunctionBuilder::GetConstantAddress(build,this_00[1]._vptr_DObject,'\x01');
    VMFunctionBuilder::Emit(build,0x49,uVar4,2,1);
    uVar3 = uVar3 & 0xffff;
    VMFunctionBuilder::Emit(build,0x4d,0,3,uVar3);
    ExpEmit::Free(&clsname,build);
    uVar6 = 0x1030000;
  }
  else {
    uVar3 = VMFunctionBuilder::GetConstantAddress(build,(void *)0x0,'\x01');
    uVar3 = uVar3 & 0xffff;
    uVar6 = 0x101030000;
  }
  return (ExpEmit)(uVar3 | uVar6);
}

Assistant:

ExpEmit FxClassTypeCast::Emit(VMFunctionBuilder *build)
{
	if (basex->ValueType != TypeName)
	{
		return ExpEmit(build->GetConstantAddress(nullptr, ATAG_OBJECT), REGT_POINTER, true);
	}
	ExpEmit clsname = basex->Emit(build);
	assert(!clsname.Konst);
	ExpEmit dest(build, REGT_POINTER);
	build->Emit(OP_PARAM, 0, clsname.RegType, clsname.RegNum);
	build->Emit(OP_PARAM, 0, REGT_POINTER | REGT_KONST, build->GetConstantAddress(const_cast<PClass *>(desttype), ATAG_OBJECT));

	// Call the BuiltinNameToClass function to convert from 'name' to class.
	VMFunction *callfunc;
	PSymbol *sym = FindBuiltinFunction(NAME_BuiltinNameToClass, BuiltinNameToClass);

	assert(sym->IsKindOf(RUNTIME_CLASS(PSymbolVMFunction)));
	assert(((PSymbolVMFunction *)sym)->Function != nullptr);
	callfunc = ((PSymbolVMFunction *)sym)->Function;

	build->Emit(OP_CALL_K, build->GetConstantAddress(callfunc, ATAG_OBJECT), 2, 1);
	build->Emit(OP_RESULT, 0, REGT_POINTER, dest.RegNum);
	clsname.Free(build);
	return dest;
}